

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

IVec3 __thiscall
deqp::gles31::Functional::anon_unknown_0::getTestedSize
          (anon_unknown_0 *this,deUint32 target,deUint32 format,IVec3 *targetSize)

{
  bool bVar1;
  ulong uVar2;
  int i_1;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  Vector<int,_3> *res_2;
  ulong uVar8;
  uint uVar9;
  IVec3 IVar10;
  IVec3 texelBlockPixelSize;
  Vector<int,_3> res;
  Vector<int,_3> res_1;
  uint local_44 [7];
  int local_28 [4];
  
  getTexelBlockPixelSize((anon_unknown_0 *)local_44,format);
  if ((target == 0x806f) || (target == 0x8c1a)) {
    local_44[5] = 0;
    local_44[3] = 0;
    local_44[4] = 0;
    lVar6 = 0;
    do {
      iVar7 = targetSize->m_data[lVar6] % (int)local_44[lVar6];
      local_44[lVar6 + 3] = targetSize->m_data[lVar6] / (int)local_44[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_28[2] = 0;
    local_28[0] = 0;
    local_28[1] = 0;
    lVar6 = 0;
    do {
      local_28[lVar6] = local_44[lVar6 + 3] + 1;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    *(undefined4 *)(this + 8) = 0;
    *(undefined8 *)this = 0;
    lVar6 = 0;
    do {
      *(uint *)(this + lVar6 * 4) = local_44[lVar6] * local_28[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
  }
  else {
    if (target == 0x8513) {
      uVar3 = local_44[1];
      if ((int)local_44[1] < (int)local_44[0]) {
        uVar3 = local_44[0];
      }
      uVar5 = (ulong)uVar3;
      if ((int)local_44[0] < (int)local_44[1]) {
        local_44[1] = local_44[0];
      }
      iVar4 = 1;
      if (3 < (int)local_44[1]) {
        uVar9 = local_44[1] >> 1;
        do {
          uVar8 = (ulong)local_44[1];
          iVar7 = (int)uVar5 % (int)uVar9;
          while (uVar3 = (uint)uVar5, iVar7 == 0) {
            local_44[1] = (uint)uVar8;
            if ((int)local_44[1] % (int)uVar9 != 0) break;
            uVar8 = (long)(int)local_44[1] / (long)(int)uVar9 & 0xffffffff;
            local_44[1] = (uint)((long)(int)local_44[1] / (long)(int)uVar9);
            iVar4 = iVar4 * uVar9;
            uVar2 = (long)(int)uVar3 / (long)(int)uVar9;
            uVar5 = uVar2 & 0xffffffff;
            iVar7 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) %
                         (long)(int)uVar9);
          }
          bVar1 = 2 < (int)uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar1);
      }
      iVar4 = uVar3 * local_44[1] * iVar4;
      iVar7 = targetSize->m_data[0] % iVar4;
      iVar4 = (targetSize->m_data[0] / iVar4 + 1) * iVar4;
      *(int *)this = iVar4;
    }
    else {
      iVar7 = targetSize->m_data[1] % (int)local_44[1];
      iVar4 = (targetSize->m_data[1] / (int)local_44[1] + -1) * local_44[1];
      *(uint *)this = (targetSize->m_data[0] / (int)local_44[0] + 1) * local_44[0];
    }
    *(int *)(this + 4) = iVar4;
    *(undefined4 *)(this + 8) = 1;
  }
  IVar10.m_data[2] = iVar7;
  IVar10.m_data._0_8_ = this;
  return (IVec3)IVar10.m_data;
}

Assistant:

IVec3 getTestedSize (deUint32 target, deUint32 format, const IVec3& targetSize)
{
	const IVec3 texelBlockPixelSize = getTexelBlockPixelSize(format);
	const bool	isCube				= target == GL_TEXTURE_CUBE_MAP;
	const bool	is3D				= target == GL_TEXTURE_3D || target == GL_TEXTURE_2D_ARRAY;

	if (isCube)
	{
		const int	multiplier	= smallestCommonMultiple(texelBlockPixelSize.x(), texelBlockPixelSize.y());
		const int	size		= (1 + (targetSize.x() / multiplier)) * multiplier;

		return IVec3(size, size, 1);
	}
	else if (is3D)
	{
		return (1 + (targetSize / texelBlockPixelSize)) * texelBlockPixelSize;
	}
	else
	{
		const int width = (1 + targetSize.x() / texelBlockPixelSize.x()) * texelBlockPixelSize.x();
		const int height = ((targetSize.y() / texelBlockPixelSize.y()) - 1) * texelBlockPixelSize.y();

		return IVec3(width, height, 1);
	}
}